

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *puVar1;
  long lVar2;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  __result;
  __normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
  __last;
  long lVar3;
  
  __result._M_current =
       (this->ExportBuildFileGenerators).
       super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->ExportBuildFileGenerators).
           super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)puVar1 - (long)__result._M_current;
  for (lVar3 = lVar2 >> 5; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (((__result._M_current)->_M_t).
        super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
        .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen)
    goto LAB_0034aa2c;
    if (__result._M_current[1]._M_t.
        super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
        .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen) {
      __result._M_current = __result._M_current + 1;
      goto LAB_0034aa2c;
    }
    if (__result._M_current[2]._M_t.
        super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
        .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen) {
      __result._M_current = __result._M_current + 2;
      goto LAB_0034aa2c;
    }
    if (__result._M_current[3]._M_t.
        super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
        .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen) {
      __result._M_current = __result._M_current + 3;
      goto LAB_0034aa2c;
    }
    __result._M_current = __result._M_current + 4;
    lVar2 = lVar2 + -0x20;
  }
  lVar2 = lVar2 >> 3;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      if (lVar2 != 3) {
        return;
      }
      if (((__result._M_current)->_M_t).
          super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
          .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen)
      goto LAB_0034aa2c;
      __result._M_current = __result._M_current + 1;
    }
    if (((__result._M_current)->_M_t).
        super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
        .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl == gen)
    goto LAB_0034aa2c;
    __result._M_current = __result._M_current + 1;
  }
  if (((__result._M_current)->_M_t).
      super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
      .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl != gen) {
    __result._M_current = puVar1;
  }
LAB_0034aa2c:
  if (__result._M_current == puVar1) {
    return;
  }
  __last._M_current =
       (this->ExportBuildFileGenerators).
       super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__result._M_current + 1 != __last._M_current) {
    std::
    __copy_move_a<true,__gnu_cxx::__normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>*,std::vector<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>,std::allocator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>*,std::vector<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>,std::allocator<std::unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>>>>>
              (__result._M_current + 1,__last,__result);
    __last._M_current =
         (this->ExportBuildFileGenerators).
         super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __last._M_current + -1;
  std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>::
  ~unique_ptr(__last._M_current + -1);
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
  cmExportBuildFileGenerator* gen)
{
  auto it =
    std::find_if(this->ExportBuildFileGenerators.begin(),
                 this->ExportBuildFileGenerators.end(),
                 [gen](std::unique_ptr<cmExportBuildFileGenerator> const& p) {
                   return p.get() == gen;
                 });
  if (it != this->ExportBuildFileGenerators.end()) {
    this->ExportBuildFileGenerators.erase(it);
  }
}